

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O2

void * __thiscall
Diligent::FixedBlockMemoryAllocator::MemoryPage::GetBlockStartAddress
          (MemoryPage *this,Uint32 BlockIndex)

{
  FixedBlockMemoryAllocator *pFVar1;
  string msg;
  
  pFVar1 = this->m_pOwnerAllocator;
  if (pFVar1 == (FixedBlockMemoryAllocator *)0x0) {
    FormatString<char[26],char[29]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pOwnerAllocator != nullptr",(char (*) [29])0x0);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetBlockStartAddress",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0x54);
    std::__cxx11::string::~string((string *)&msg);
    pFVar1 = this->m_pOwnerAllocator;
  }
  if (pFVar1->m_NumBlocksInPage <= BlockIndex) {
    FormatString<char[20]>(&msg,(char (*) [20])"Invalid block index");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetBlockStartAddress",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0x55);
    std::__cxx11::string::~string((string *)&msg);
    pFVar1 = this->m_pOwnerAllocator;
  }
  return (void *)((ulong)BlockIndex * pFVar1->m_BlockSize + (long)this->m_pPageStart);
}

Assistant:

void* FixedBlockMemoryAllocator::MemoryPage::GetBlockStartAddress(Uint32 BlockIndex) const
{
    VERIFY_EXPR(m_pOwnerAllocator != nullptr);
    VERIFY(BlockIndex < m_pOwnerAllocator->m_NumBlocksInPage, "Invalid block index");
    return reinterpret_cast<Uint8*>(m_pPageStart) + BlockIndex * m_pOwnerAllocator->m_BlockSize;
}